

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool arm_s1_regime_using_lpae_format_aarch64(CPUARMState_conflict *env,ARMMMUIdx mmu_idx)

{
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  TCR *pTVar6;
  _Bool _Var7;
  
  if (mmu_idx == ARMMMUIdx_E10_0) {
    mmu_idx = ARMMMUIdx_Stage1_E0;
  }
  else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
    mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
  }
  else if (mmu_idx == ARMMMUIdx_E10_1) {
    mmu_idx = ARMMMUIdx_Stage1_E1;
  }
  uVar2 = regime_el(env,mmu_idx);
  _Var7 = true;
  if (uVar2 != 2) {
    uVar1 = env->features;
    uVar3 = ((uint)uVar1 & 0x10000000) >> 0x1c;
    uVar5 = (ulong)uVar3;
    if (uVar2 != 3) {
      uVar4 = 0;
      if ((uVar1 & 0x200000000) == 0) {
        uVar4 = uVar3;
      }
      if ((~uVar1 & 0x210000000) == 0) {
        uVar4 = (uint)(env->cp15).scr_el3 >> 10;
      }
      uVar5 = (ulong)uVar4;
      if (((uVar1 >> 0x20 & 1) != 0) &&
         (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
        if ((uVar4 & 1) == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (env->cp15).hcr_el2 >> 0x1f;
        }
      }
    }
    if ((uVar5 & 1) == 0) {
      if (((uint)uVar1 >> 0x1a & 1) != 0) {
        if (mmu_idx == ARMMMUIdx_Stage2) {
          pTVar6 = &(env->cp15).vtcr_el2;
        }
        else {
          uVar2 = regime_el(env,mmu_idx);
          pTVar6 = (env->cp15).tcr_el + uVar2;
        }
        if ((pTVar6->raw_tcr & 0x80000000) != 0) {
          return true;
        }
      }
      _Var7 = false;
    }
  }
  return _Var7;
}

Assistant:

bool arm_s1_regime_using_lpae_format(CPUARMState *env, ARMMMUIdx mmu_idx)
{
    mmu_idx = stage_1_mmu_idx(mmu_idx);

    return regime_using_lpae_format(env, mmu_idx);
}